

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  uint uVar7;
  int in_EDX;
  int Fill;
  Abc_Obj_t *pNode_00;
  long lVar8;
  
  uVar7 = *(uint *)&pNode->field_0x14;
  uVar5 = uVar7 & 0xf;
  if (uVar5 == 5) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    uVar7 = *(uint *)&pNode->field_0x14;
    uVar5 = uVar7 & 0xf;
  }
  else if (uVar5 == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x30d,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (uVar5 != 2) {
    if ((uVar5 != 7) && (uVar5 != 10 && (uVar7 & 0xe) != 8)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x312,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    pAVar3 = pNode->pNtk;
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if (0 < (pNode->vFanins).nSize) {
        lVar8 = 0;
        do {
          pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
          if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10)
          {
            pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
          }
          if ((*(uint *)&pNode_00->field_0x14 & 0xf) != 6) {
            __assert_fail("Abc_ObjIsNet(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                          ,0x31a,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
          }
          if (pNode_00->pNtk->ntkType == ABC_NTK_NETLIST) {
            pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
          }
          Abc_NtkDfsWithBoxes_rec(pNode_00,vNodes);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pNode->vFanins).nSize);
      }
      uVar7 = vNodes->nSize;
      if (uVar7 == vNodes->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar6 = vNodes->pArray;
      }
      iVar1 = vNodes->nSize;
      vNodes->nSize = iVar1 + 1;
      ppvVar6[iVar1] = pNode;
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsWithBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsBo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode ) );
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        assert( Abc_ObjIsNet(pFanin) );
        Abc_NtkDfsWithBoxes_rec( Abc_ObjFanin0Ntk(pFanin), vNodes );
    }
    Vec_PtrPush( vNodes, pNode );
}